

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmrun.cpp
# Opt level: O1

void __thiscall CVmRun::set_say_func(CVmRun *this,vm_val_t *val)

{
  anon_union_8_8_cb74652f_for_val aVar1;
  undefined4 uVar2;
  vm_globalvar_t *pvVar3;
  
  if (this->say_func_ == (vm_globalvar_t *)0x0) {
    pvVar3 = CVmObjTable::create_global_var(&G_obj_table_X);
    this->say_func_ = pvVar3;
  }
  pvVar3 = this->say_func_;
  uVar2 = *(undefined4 *)&val->field_0x4;
  aVar1 = val->val;
  (pvVar3->val).typ = val->typ;
  *(undefined4 *)&(pvVar3->val).field_0x4 = uVar2;
  (pvVar3->val).val = aVar1;
  return;
}

Assistant:

void CVmRun::set_say_func(VMG_ const vm_val_t *val)
{
    /* 
     *   if we haven't yet allocated a global to hold the 'say' function,
     *   allocate one now 
     */
    if (say_func_ == 0)
        say_func_ = G_obj_table->create_global_var();

    /* remember the new function */
    say_func_->val = *val;
}